

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_limit_h(REF_DBL *metric,REF_GRID ref_grid,REF_DBL hmin,REF_DBL hmax)

{
  uint uVar1;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT node;
  REF_DBL eig;
  REF_DBL diag_system [12];
  REF_DBL hmax_local;
  REF_DBL hmin_local;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  ref_private_macro_code_rss_1 = 0;
  do {
    if (ref_grid->node->max <= ref_private_macro_code_rss_1) {
      return 0;
    }
    if (((-1 < ref_private_macro_code_rss_1) && (ref_private_macro_code_rss_1 < ref_grid->node->max)
        ) && (-1 < ref_grid->node->global[ref_private_macro_code_rss_1])) {
      uVar1 = ref_matrix_diag_m(metric + ref_private_macro_code_rss_1 * 6,&eig);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x83e,"ref_metric_limit_h",(ulong)uVar1,"eigen decomp");
        return uVar1;
      }
      if (0.0 < hmin) {
        local_c8 = 1.0 / (hmin * hmin);
        local_b8 = local_c8;
        if (eig < local_c8) {
          local_b8 = eig;
        }
        eig = local_b8;
        local_c0 = local_c8;
        if (diag_system[0] < local_c8) {
          local_c0 = diag_system[0];
        }
        diag_system[0] = local_c0;
        if (diag_system[1] < local_c8) {
          local_c8 = diag_system[1];
        }
        diag_system[1] = local_c8;
      }
      if (0.0 < hmax) {
        local_e0 = 1.0 / (hmax * hmax);
        local_d0 = local_e0;
        if (local_e0 < eig) {
          local_d0 = eig;
        }
        eig = local_d0;
        local_d8 = local_e0;
        if (local_e0 < diag_system[0]) {
          local_d8 = diag_system[0];
        }
        diag_system[0] = local_d8;
        if (local_e0 < diag_system[1]) {
          local_e0 = diag_system[1];
        }
        diag_system[1] = local_e0;
      }
      uVar1 = ref_matrix_form_m(&eig,metric + ref_private_macro_code_rss_1 * 6);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x84b,"ref_metric_limit_h",(ulong)uVar1,"reform m");
        return uVar1;
      }
    }
    ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_limit_h(REF_DBL *metric, REF_GRID ref_grid,
                                      REF_DBL hmin, REF_DBL hmax) {
  REF_DBL diag_system[12];
  REF_DBL eig;
  REF_INT node;
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "eigen decomp");
    if (hmin > 0.0) {
      eig = 1.0 / (hmin * hmin);
      ref_matrix_eig(diag_system, 0) = MIN(ref_matrix_eig(diag_system, 0), eig);
      ref_matrix_eig(diag_system, 1) = MIN(ref_matrix_eig(diag_system, 1), eig);
      ref_matrix_eig(diag_system, 2) = MIN(ref_matrix_eig(diag_system, 2), eig);
    }
    if (hmax > 0.0) {
      eig = 1.0 / (hmax * hmax);
      ref_matrix_eig(diag_system, 0) = MAX(ref_matrix_eig(diag_system, 0), eig);
      ref_matrix_eig(diag_system, 1) = MAX(ref_matrix_eig(diag_system, 1), eig);
      ref_matrix_eig(diag_system, 2) = MAX(ref_matrix_eig(diag_system, 2), eig);
    }
    RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform m");
  }
  return REF_SUCCESS;
}